

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O3

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_1,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  double dVar1;
  RhsScalar *pRVar2;
  ulong stride;
  int iVar3;
  LhsScalar *pLVar4;
  ulong uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  LhsScalar *pLVar13;
  long lVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  double dVar21;
  double local_198;
  ulong local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  ulong local_168;
  long local_160;
  long local_158;
  RhsScalar *local_150;
  double *local_148;
  double *local_140;
  double *local_138;
  ulong local_130;
  long local_128;
  double *local_120;
  double *local_118;
  double *local_110;
  ulong local_108;
  LhsScalar *local_100;
  RhsScalar *local_f8;
  double *local_f0;
  long local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  long local_b8;
  ulong local_b0;
  double *local_a8;
  long local_a0;
  RhsScalar *local_98;
  long local_90;
  ulong local_88;
  long local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  LhsScalar *local_60;
  blas_data_mapper<double,_long,_0,_0> local_58;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_0,_false,_true>
  local_41;
  double *pdStack_40;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_0,_false,_true>
  pack_rhs;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
  local_32;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
  local_31 [7];
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
  gebp_kernel;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
  pack_lhs;
  
  pLVar13 = &local_198;
  local_a0 = triStride;
  local_f0 = _tri;
  local_70 = size;
  local_b8 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    local_b8 = size;
  }
  local_68 = blocking->m_kc;
  uVar20 = local_b8 * blocking->m_kc;
  if (uVar20 >> 0x3d != 0) {
LAB_00118333:
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = time;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_60 = blocking->m_blockA;
  local_78 = otherSize;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (uVar20 < 0x4001) {
      pLVar4 = (LhsScalar *)((long)&local_198 - (uVar20 * 8 + 0x1e & 0xfffffffffffffff0));
      local_60 = pLVar4;
      pLVar13 = pLVar4;
    }
    else {
      pLVar4 = (LhsScalar *)malloc(uVar20 * 8);
      if (((ulong)pLVar4 & 0xf) != 0) goto LAB_001183c7;
      local_60 = pLVar4;
      pLVar13 = &local_198;
      if (pLVar4 == (LhsScalar *)0x0) goto LAB_00118333;
    }
  }
  else {
    pLVar4 = (LhsScalar *)0x0;
    pLVar13 = &local_198;
  }
  uVar7 = local_68 * local_78;
  local_b0 = uVar7;
  if (0x1fffffffffffffff < uVar7) {
    pLVar13[-1] = 5.6706631534252e-318;
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = time;
    pLVar13[-1] = 5.6708410170577e-318;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_98 = blocking->m_blockB;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (uVar7 < 0x4001) {
      local_f8 = (RhsScalar *)((long)pLVar13 - (uVar7 * 8 + 0x1e & 0xfffffffffffffff0));
      local_98 = local_f8;
      pLVar13 = local_f8;
    }
    else {
      pLVar13[-1] = 5.66179467508235e-318;
      local_f8 = (RhsScalar *)malloc(uVar7 * 8);
      if (((ulong)local_f8 & 0xf) != 0) {
LAB_001183c7:
        *(undefined8 *)((long)pLVar13 + -8) = 0x1183e6;
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade alignd memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/util/Memory.h"
                      ,0xa1,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      local_98 = local_f8;
      if (local_f8 == (RhsScalar *)0x0) {
        pLVar13[-1] = 5.67132026073417e-318;
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = time;
        pLVar13[-1] = (LhsScalar)&LAB_00118414;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_f8 = (RhsScalar *)0x0;
  }
  local_108 = uVar20;
  local_100 = pLVar4;
  if (manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes == '\0') {
    pLVar13[-1] = 5.6709003049352e-318;
    iVar3 = __cxa_guard_acquire(&manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes
                               );
    if (iVar3 != 0) {
      pLVar13[-1] = 5.67099911806437e-318;
      CacheSizes::CacheSizes
                ((CacheSizes *)&manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes)
      ;
      pLVar13[-1] = 5.67105840594187e-318;
      __cxa_guard_release(&manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes);
    }
  }
  if (local_78 < 1) {
    local_c0 = (double *)0x0;
  }
  else {
    uVar20 = local_70;
    if ((long)local_70 < otherStride) {
      uVar20 = otherStride;
    }
    uVar7 = DAT_0013b808 / (uVar20 << 5);
    uVar20 = uVar7 + 3;
    if (-1 < (long)uVar7) {
      uVar20 = uVar7;
    }
    local_c0 = (double *)(uVar20 & 0xfffffffffffffffc);
  }
  if ((long)local_c0 < 5) {
    local_c0 = (double *)0x4;
  }
  if (0 < (long)local_70) {
    local_110 = _other + 1;
    local_160 = local_68 * 8;
    local_170 = otherStride * (long)local_c0 * 8;
    local_138 = local_f0 + 1;
    local_198 = (double)(local_a0 * 8 + 8);
    local_158 = local_68 * (long)local_198;
    local_180 = local_a0 * 0x20 + 0x20;
    local_128 = local_70 - local_68;
    local_120 = _other + local_68;
    local_178 = local_b8 * 8;
    local_118 = local_f0 + local_68;
    local_80 = 0;
    local_130 = local_70;
    uVar20 = local_70;
    do {
      local_168 = local_130;
      if ((long)local_68 < (long)local_130) {
        local_168 = local_68;
      }
      uVar7 = uVar20 - local_80;
      if ((long)local_68 < (long)(uVar20 - local_80)) {
        uVar7 = local_68;
      }
      local_88 = uVar7;
      if (0 < local_78) {
        local_c8 = local_110;
        lVar11 = 0;
        do {
          local_90 = lVar11;
          local_a8 = (double *)(local_78 - lVar11);
          pdVar15 = local_a8;
          if ((long)local_c0 < (long)local_a8) {
            pdVar15 = local_c0;
          }
          local_d0 = pdVar15;
          if (0 < (long)uVar7) {
            local_150 = local_98 + lVar11 * uVar7;
            local_148 = _other + lVar11 * otherStride;
            local_d8 = local_138;
            local_140 = local_c8;
            lVar10 = 0;
            uVar20 = local_168;
            do {
              stride = local_88;
              pdVar16 = local_d0;
              pRVar2 = local_150;
              local_190 = uVar20;
              uVar5 = 4;
              if ((long)uVar20 < 4) {
                uVar5 = uVar20;
              }
              if ((long)uVar5 < 2) {
                uVar5 = 1;
              }
              local_e0 = (double *)(uVar7 - lVar10);
              pdVar12 = (double *)0x4;
              if ((long)local_e0 < 4) {
                pdVar12 = local_e0;
              }
              local_e8 = lVar10;
              pdStack_40 = (double *)(local_80 + lVar10);
              if (0 < (long)local_e0) {
                uVar20 = 0;
                pdVar8 = local_d8;
                pdVar9 = local_140;
                do {
                  if (0 < (long)local_a8) {
                    lVar14 = (long)pdStack_40 + uVar20;
                    dVar1 = local_f0[lVar14 * local_a0 + lVar14];
                    pdVar17 = pdVar9;
                    lVar18 = local_90;
                    do {
                      dVar21 = _other[lVar18 * otherStride + lVar14] * (1.0 / dVar1);
                      _other[lVar18 * otherStride + lVar14] = dVar21;
                      if (0 < (long)(~uVar20 + (long)pdVar12)) {
                        lVar19 = 0;
                        do {
                          pdVar17[lVar19] = pdVar8[lVar19] * -dVar21 + pdVar17[lVar19];
                          lVar19 = lVar19 + 1;
                        } while (lVar19 < (long)(~uVar20 + (long)pdVar12));
                      }
                      lVar18 = lVar18 + 1;
                      pdVar17 = pdVar17 + otherStride;
                    } while (lVar18 < (long)pdVar15 + lVar11);
                  }
                  uVar20 = uVar20 + 1;
                  pdVar9 = pdVar9 + 1;
                  pdVar8 = (double *)((long)pdVar8 + (long)local_198);
                } while (uVar20 != uVar5);
              }
              local_58.m_data = local_148 + (long)pdStack_40;
              local_58.m_stride = otherStride;
              pLVar13[-2] = (LhsScalar)lVar10;
              pLVar13[-3] = 5.66643889215326e-318;
              gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_0,_false,_true>
              ::operator()(&local_41,pRVar2,&local_58,(long)pdVar12,(long)pdVar16,stride,
                           (long)pLVar13[-2]);
              pLVar4 = local_60;
              pdVar16 = (double *)((long)local_e0 - (long)pdVar12);
              if (0 < (long)pdVar16) {
                local_188 = (long)pdVar12 + (long)pdStack_40;
                local_58.m_data =
                     local_f0 + (long)pdStack_40 * local_a0 + (long)pdVar12 + (long)pdStack_40;
                local_58.m_stride = local_a0;
                pdStack_40 = pdVar12;
                local_e0 = pdVar16;
                pLVar13[-2] = 0.0;
                pLVar13[-3] = 5.66700706764597e-318;
                gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
                ::operator()(local_31,pLVar4,(const_blas_data_mapper<double,_long,_0> *)&local_58,
                             (long)pdVar12,(long)pdVar16,0,(long)pLVar13[-2]);
                pdVar12 = pdStack_40;
                pLVar4 = local_60;
                pdVar16 = local_e0;
                pRVar2 = local_150;
                local_58.m_data = local_148 + local_188;
                local_58.m_stride = otherStride;
                pLVar13[-2] = (LhsScalar)local_e8;
                pLVar13[-3] = 0.0;
                pLVar13[-4] = (LhsScalar)local_88;
                pLVar13[-5] = (LhsScalar)pdVar12;
                pLVar13[-6] = (LhsScalar)local_d0;
                pLVar13[-7] = 5.66747643000952e-318;
                gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
                ::operator()(&local_32,&local_58,pLVar4,pRVar2,(long)pdVar16,(long)pdVar12,
                             (long)pLVar13[-6],-1.0,(long)pLVar13[-5],(long)pLVar13[-4],
                             (long)pLVar13[-3],(long)pLVar13[-2]);
              }
              lVar10 = local_e8 + 4;
              uVar20 = local_190 - 4;
              local_140 = local_140 + 4;
              local_d8 = (double *)((long)local_d8 + local_180);
              uVar7 = local_88;
            } while (lVar10 < (long)local_88);
          }
          lVar11 = local_90 + (long)local_c0;
          local_c8 = (double *)((long)local_c8 + local_170);
        } while (lVar11 < local_78);
      }
      lVar18 = local_80 + local_68;
      local_80 = lVar18;
      uVar20 = local_70;
      lVar11 = local_b8;
      pdVar15 = local_118;
      pdVar16 = local_120;
      lVar10 = local_128;
      if ((long)local_70 <= lVar18) break;
      do {
        pLVar4 = local_60;
        lVar19 = lVar10 - lVar11;
        lVar14 = lVar10;
        if (lVar11 <= lVar10) {
          lVar14 = lVar11;
        }
        lVar10 = lVar19;
        if (0 < lVar14) {
          local_90 = lVar19;
          local_a8 = pdVar16;
          pdStack_40 = pdVar15;
          local_58.m_data = pdVar15;
          local_58.m_stride = local_a0;
          pLVar13[-2] = 0.0;
          pLVar13[-3] = 5.66883511053559e-318;
          gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
          ::operator()(local_31,pLVar4,(const_blas_data_mapper<double,_long,_0> *)&local_58,uVar7,
                       lVar14,0,(long)pLVar13[-2]);
          local_58.m_data = local_a8;
          local_58.m_stride = otherStride;
          pLVar13[-3] = 0.0;
          pLVar13[-2] = 0.0;
          pLVar13[-4] = -NAN;
          pLVar13[-5] = -NAN;
          pLVar13[-6] = (LhsScalar)local_78;
          pLVar4 = local_60;
          uVar20 = local_88;
          pRVar2 = local_98;
          pLVar13[-7] = 5.66931435421205e-318;
          gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
          ::operator()(&local_32,&local_58,pLVar4,pRVar2,lVar14,uVar20,(long)pLVar13[-6],-1.0,
                       (long)pLVar13[-5],(long)pLVar13[-4],(long)pLVar13[-3],(long)pLVar13[-2]);
          uVar20 = local_70;
          lVar11 = local_b8;
          pdVar15 = pdStack_40;
          pdVar16 = local_a8;
          uVar7 = local_88;
          lVar10 = local_90;
        }
        lVar18 = lVar18 + lVar11;
        pdVar16 = (double *)((long)pdVar16 + local_178);
        pdVar15 = (double *)((long)pdVar15 + local_178);
      } while (lVar18 < (long)uVar20);
      local_130 = local_130 - local_68;
      local_110 = (double *)((long)local_110 + local_160);
      local_138 = (double *)((long)local_138 + local_158);
      local_128 = local_128 - local_68;
      local_120 = (double *)((long)local_120 + local_160);
      local_118 = (double *)((long)local_118 + local_158);
    } while (local_80 < (long)uVar20);
  }
  pRVar2 = local_f8;
  if (0x4000 < local_b0) {
    pLVar13[-1] = 5.67018885040519e-318;
    free(pRVar2);
  }
  pLVar4 = local_100;
  if (0x4000 < local_108) {
    pLVar13[-1] = 5.67031236681665e-318;
    free(pLVar4);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;

    typedef const_blas_data_mapper<Scalar, Index, TriStorageOrder> TriMapper;
    typedef blas_data_mapper<Scalar, Index, ColMajor> OtherMapper;
    TriMapper tri(_tri, triStride);
    OtherMapper other(_other, otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;

    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, OtherMapper, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, TriMapper, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, OtherMapper, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2, l3;
    manage_caching_sizes(GetAction, &l1, &l2, &l3);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, other.getSubMapper(startBlock,j2), actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, tri.getSubMapper(startTarget,startBlock), actualPanelWidth, lengthTarget);

            gebp_kernel(other.getSubMapper(startTarget,j2), blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, tri.getSubMapper(i2, IsLower ? k2 : k2-kc), actual_kc, actual_mc);

            gebp_kernel(other.getSubMapper(i2, 0), blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0);
          }
        }
      }
    }
  }